

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::basic_substring<char>::last_of(basic_substring<char> *this,char c,size_t start)

{
  bool bVar1;
  error_flags eVar2;
  size_t in_RDX;
  char in_SIL;
  long *in_RDI;
  size_t i;
  size_t local_38;
  
  bVar1 = true;
  if (in_RDX != 0xffffffffffffffff) {
    bVar1 = in_RDX <= (ulong)in_RDI[1];
  }
  if (!bVar1) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x34dd90,(char *)0x170f,"check failed: %s",
                 "start == npos || (start >= 0 && start <= len)");
  }
  if (in_RDX == 0xffffffffffffffff) {
    in_RDX = in_RDI[1];
  }
  do {
    local_38 = in_RDX - 1;
    if (local_38 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    in_RDX = local_38;
  } while (*(char *)(*in_RDI + local_38) != in_SIL);
  return local_38;
}

Assistant:

size_t last_of(const C c, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            if(str[i] == c)
                return i;
        }
        return npos;
    }